

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O3

FT_Error parse_fd_array(CID_Face face,CID_Parser *parser)

{
  FT_Memory memory;
  FT_Stream pFVar1;
  ulong uVar2;
  CID_FaceDict pCVar3;
  FT_Int *pFVar4;
  FT_Error FVar5;
  uint uVar6;
  ulong new_count;
  FT_Error local_2c [2];
  FT_Error error;
  
  memory = (face->root).memory;
  pFVar1 = parser->stream;
  local_2c[0] = 0;
  uVar2 = (*(parser->root).funcs.to_int)(&parser->root);
  if ((long)uVar2 < 0) {
    FVar5 = 3;
  }
  else {
    new_count = pFVar1->size / 100;
    if (uVar2 < new_count) {
      new_count = uVar2;
    }
    FVar5 = 0;
    if ((face->cid).font_dicts == (CID_FaceDict)0x0) {
      pCVar3 = (CID_FaceDict)ft_mem_realloc(memory,0x150,0,new_count,(void *)0x0,local_2c);
      (face->cid).font_dicts = pCVar3;
      FVar5 = local_2c[0];
      if (local_2c[0] == 0) {
        uVar6 = (uint)new_count;
        (face->cid).num_dicts = uVar6;
        FVar5 = 0;
        if (0 < (int)uVar6) {
          uVar2 = (ulong)(uVar6 & 0x7fffffff);
          pFVar4 = &(pCVar3->private_dict).lenIV;
          do {
            *pFVar4 = 4;
            pFVar4 = pFVar4 + 0x54;
            uVar2 = uVar2 - 1;
            FVar5 = local_2c[0];
          } while (uVar2 != 0);
        }
      }
    }
  }
  return FVar5;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  parse_fd_array( CID_Face     face,
                  CID_Parser*  parser )
  {
    CID_FaceInfo  cid    = &face->cid;
    FT_Memory     memory = face->root.memory;
    FT_Stream     stream = parser->stream;
    FT_Error      error  = FT_Err_Ok;
    FT_Long       num_dicts;


    num_dicts = cid_parser_to_int( parser );
    if ( num_dicts < 0 )
    {
      FT_ERROR(( "parse_fd_array: invalid number of dictionaries\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /*
     * A single entry in the FDArray must (at least) contain the following
     * structure elements.
     *
     *   %ADOBeginFontDict              18
     *   X dict begin                   13
     *     /FontMatrix [X X X X]        22
     *     /Private X dict begin        22
     *     end                           4
     *   end                             4
     *   %ADOEndFontDict                16
     *
     * This needs 18+13+22+22+4+4+16=99 bytes or more.  Normally, you also
     * need a `dup X' at the very beginning and a `put' at the end, so a
     * rough guess using 100 bytes as the minimum is justified.
     */
    if ( (FT_ULong)num_dicts > stream->size / 100 )
    {
      FT_TRACE0(( "parse_fd_array: adjusting FDArray size"
                  " (from %d to %d)\n",
                  num_dicts,
                  stream->size / 100 ));
      num_dicts = (FT_Long)( stream->size / 100 );
    }

    if ( !cid->font_dicts )
    {
      FT_Int  n;


      if ( FT_NEW_ARRAY( cid->font_dicts, num_dicts ) )
        goto Exit;

      cid->num_dicts = num_dicts;

      /* don't forget to set a few defaults */
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_FaceDict  dict = cid->font_dicts + n;


        /* default value for lenIV */
        dict->private_dict.lenIV = 4;
      }
    }

  Exit:
    return error;
  }